

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_BrepLoop * __thiscall ON_BrepLoop::operator=(ON_BrepLoop *this,ON_BrepLoop *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  
  if (src != this) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    this->m_loop_user = src->m_loop_user;
    this->m_status = src->m_status;
    this->m_loop_index = src->m_loop_index;
    ON_SimpleArray<int>::operator=(&this->m_ti,&src->m_ti);
    iVar6 = src->m_fi;
    this->m_type = src->m_type;
    this->m_fi = iVar6;
    dVar1 = (src->m_pbox).m_min.x;
    dVar2 = (src->m_pbox).m_min.y;
    dVar3 = (src->m_pbox).m_min.z;
    dVar4 = (src->m_pbox).m_max.x;
    dVar5 = (src->m_pbox).m_max.z;
    (this->m_pbox).m_max.y = (src->m_pbox).m_max.y;
    (this->m_pbox).m_max.z = dVar5;
    (this->m_pbox).m_min.z = dVar3;
    (this->m_pbox).m_max.x = dVar4;
    (this->m_pbox).m_min.x = dVar1;
    (this->m_pbox).m_min.y = dVar2;
  }
  return this;
}

Assistant:

ON_BrepLoop& ON_BrepLoop::operator=(const ON_BrepLoop& src)
{
  if ( &src != this ) 
  {
    // do not copy m_brep pointer
    ON_Object::operator=(src);
    m_loop_user   = src.m_loop_user;
    m_status      = src.m_status;
    m_loop_index  = src.m_loop_index;
    m_ti    = src.m_ti;
    m_type  = src.m_type;
    m_fi    = src.m_fi;
    m_pbox  = src.m_pbox;
  }
  return *this;
}